

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void build_impute_node<InputData<double,int>&,WorkerMemory<ImputedData<int,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
               InputData<double,_int> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this;
  pointer puVar1;
  WeighImpRows WVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pIVar5;
  pointer pdVar6;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  uchar *puVar10;
  int *piVar11;
  ulong uVar12;
  ulong *puVar13;
  double *cat;
  ulong *key;
  size_t sVar14;
  ImputeNode *pIVar15;
  pointer pvVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  size_t col_1;
  ulong uVar21;
  ulong uVar22;
  size_t col;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int *piVar26;
  size_t sVar27;
  long lVar28;
  undefined4 uVar29;
  int iVar36;
  double dVar30;
  double *pdVar31;
  double dVar32;
  undefined4 uVar37;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double *pdVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar48;
  double dVar46;
  undefined1 auVar47 [16];
  double dVar49;
  undefined1 auVar50 [16];
  double dVar51;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar52;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  size_t ix;
  double __tmp;
  tuple<> local_b1;
  ImputeNode *local_b0;
  double *local_a8;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a0;
  double local_98;
  pointer local_90;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_78;
  unsigned_long local_70;
  undefined1 local_68 [16];
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  size_t local_48;
  ModelParams *local_40;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_38;
  
  bVar8 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  bVar9 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_98 = (double)CONCAT71(local_98._1_7_,!bVar8 || !bVar9);
  local_b0 = imputer;
  local_50 = imputer_tree;
  local_48 = curr_depth;
  local_40 = model_params;
  if (bVar8 && bVar9) {
    lVar24 = (workspace->end - workspace->st) + 1;
    auVar33._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar33._0_8_ = lVar24;
    auVar33._12_4_ = 0x45300000;
    dVar32 = auVar33._8_8_ - 1.9342813113834067e+25;
    local_68._0_8_ = dVar32 + ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
    local_68._8_8_ = dVar32;
  }
  else {
    local_68._0_8_ =
         calculate_sum_weights<double>
                   (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                    &workspace->weights_arr,&workspace->weights_map);
    local_68._8_8_ = extraout_XMM0_Qb;
  }
  pIVar15 = local_b0;
  local_a0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_b0->num_sum,input_data->ncols_numeric,(value_type_conflict *)&local_a0);
  local_88 = &pIVar15->num_weight;
  local_a0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_88,input_data->ncols_numeric,(value_type_conflict *)&local_a0);
  this = &pIVar15->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this,input_data->ncols_categ);
  local_80 = &pIVar15->cat_weight;
  local_a0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_80,input_data->ncols_categ,(value_type_conflict *)&local_a0);
  if ((pIVar15->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&pIVar15->num_sum);
  }
  if ((pIVar15->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_88)
    ;
  }
  if ((pIVar15->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(this);
  }
  if ((pIVar15->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_80)
    ;
  }
  if (input_data->ncols_categ == 0) {
    uVar12 = 0;
  }
  else {
    lVar24 = 0;
    uVar25 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar24),(long)input_data->ncat[uVar25]);
      pvVar16 = (this->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar24 + 0x10) !=
          *(long *)((long)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar24 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar24));
      }
      uVar25 = uVar25 + 1;
      uVar12 = input_data->ncols_categ;
      lVar24 = lVar24 + 0x18;
    } while (uVar25 < uVar12);
  }
  auVar33 = _DAT_0036e1d0;
  uVar25 = input_data->ncols_numeric;
  dVar32 = (double)local_68._0_8_;
  if ((uVar12 != 0) || (input_data->Xc_indptr == (int *)0x0 && uVar25 != 0)) {
    local_a8 = input_data->numeric_data;
    if (local_98._0_1_ == '\0') {
      if (uVar25 != 0 && local_a8 != (double *)0x0) {
        puVar1 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar21 = workspace->st;
        uVar23 = workspace->end;
        sVar14 = input_data->nrows;
        pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar22 = 0;
        do {
          dVar30 = 0.0;
          if (uVar21 <= uVar23) {
            pdVar4 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            lVar24 = 0;
            uVar19 = uVar21;
            do {
              uVar29 = SUB164(ZEXT816(0x4530000043300000),0);
              uVar37 = SUB164(ZEXT816(0x4530000043300000),4);
              dVar30 = auVar33._0_8_;
              dVar49 = auVar33._8_8_;
              if ((ulong)ABS(local_a8[sVar14 * uVar22 + puVar1[uVar19]]) < 0x7ff0000000000000) {
                lVar24 = lVar24 + 1;
                dVar46 = pdVar4[uVar22];
                auVar44._8_4_ = (int)((ulong)lVar24 >> 0x20);
                auVar44._0_8_ = lVar24;
                auVar44._12_4_ = uVar37;
                pdVar4[uVar22] =
                     (local_a8[sVar14 * uVar22 + puVar1[uVar19]] - dVar46) /
                     ((auVar44._8_8_ - dVar49) + ((double)CONCAT44(uVar29,(int)lVar24) - dVar30)) +
                     dVar46;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 <= uVar23);
            auVar43._8_4_ = (int)((ulong)lVar24 >> 0x20);
            auVar43._0_8_ = lVar24;
            auVar43._12_4_ = uVar37;
            dVar30 = (auVar43._8_8_ - dVar49) + ((double)CONCAT44(uVar29,(int)lVar24) - dVar30);
          }
          pdVar3[uVar22] = dVar30;
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar25);
      }
      piVar11 = input_data->categ_data;
      if (uVar12 != 0 && piVar11 != (int *)0x0) {
        puVar1 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar25 = workspace->st;
        uVar21 = workspace->end;
        sVar14 = input_data->nrows;
        pdVar3 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = 0;
        dVar30 = (double)DAT_0036e1d0;
        dVar49 = DAT_0036e1d0._8_8_;
        do {
          dVar46 = 0.0;
          if (uVar25 <= uVar21) {
            pvVar16 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar24 = 0;
            uVar22 = uVar25;
            do {
              lVar28 = (long)piVar11[sVar14 * uVar23 + puVar1[uVar22]];
              if (-1 < lVar28) {
                lVar24 = lVar24 + 1;
                lVar17 = *(long *)&pvVar16[uVar23].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar17 + lVar28 * 8) = *(double *)(lVar17 + lVar28 * 8) + 1.0;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 <= uVar21);
            auVar45._8_4_ = (int)((ulong)lVar24 >> 0x20);
            auVar45._0_8_ = lVar24;
            auVar45._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar46 = (auVar45._8_8_ - dVar49) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar24) - dVar30);
          }
          pdVar3[uVar23] = dVar46;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar12);
      }
    }
    else {
      if (uVar25 != 0 && local_a8 != (double *)0x0) {
        local_78 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)&workspace->weights_map;
        uVar12 = workspace->end;
        uVar21 = 0;
        pIVar15 = local_b0;
        do {
          uVar23 = workspace->st;
          pdVar31 = (double *)0x0;
          if (uVar23 <= uVar12) {
            lVar24 = uVar23 * 8;
            auVar41 = ZEXT816(0);
            do {
              puVar7 = (workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar28 = *(long *)((long)puVar7 + lVar24);
              puVar1 = (pointer)input_data->numeric_data[lVar28 + input_data->nrows * uVar21];
              if ((ulong)ABS((double)puVar1) < 0x7ff0000000000000) {
                pdVar3 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar3) {
                  local_a0._M_head_impl = (unsigned_long *)((long)puVar7 + lVar24);
                  local_a8 = pdVar31;
                  local_98 = auVar41._0_8_;
                  local_90 = puVar1;
                  pVar52 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     (local_78,local_a0._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_a0,(tuple<> *)&local_70
                                     );
                  puVar10 = (pVar52.first.m_bucket.m_bucket)->m_value + 8;
                  uVar12 = workspace->end;
                  dVar32 = (double)local_68._0_8_;
                  dVar30 = local_98;
                  pdVar38 = local_a8;
                  puVar1 = local_90;
                }
                else {
                  puVar10 = (uchar *)(pdVar3 + lVar28);
                  dVar30 = auVar41._0_8_;
                  pdVar38 = pdVar31;
                }
                dVar49 = *(double *)puVar10;
                pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar3[uVar21] = dVar49 + pdVar3[uVar21];
                dVar30 = (double)puVar1 * dVar49 - dVar30;
                pdVar31 = (double *)((double)pdVar38 + dVar30);
                auVar41._0_8_ = ((double)pdVar31 - (double)pdVar38) - dVar30;
                auVar41._8_8_ = 0;
              }
              uVar23 = uVar23 + 1;
              lVar24 = lVar24 + 8;
            } while (uVar23 <= uVar12);
            uVar25 = input_data->ncols_numeric;
            pIVar15 = local_b0;
          }
          (pIVar15->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21] =
               (double)pdVar31 /
               (pIVar15->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar25);
        uVar12 = input_data->ncols_categ;
      }
      if ((uVar12 != 0) && (uVar25 = workspace->st, uVar25 <= workspace->end)) {
        do {
          local_70 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar25];
          pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar3) {
            local_a0._M_head_impl = &local_70;
            pVar52 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_70,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a0,&local_b1);
            puVar10 = (pVar52.first.m_bucket.m_bucket)->m_value + 8;
            uVar12 = input_data->ncols_categ;
            dVar32 = (double)local_68._0_8_;
          }
          else {
            puVar10 = (uchar *)(pdVar3 + local_70);
          }
          if (uVar12 != 0) {
            dVar30 = *(double *)puVar10;
            sVar14 = input_data->nrows;
            piVar11 = input_data->categ_data + local_70;
            pvVar16 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar21 = 0;
            do {
              lVar24 = (long)*piVar11;
              if (-1 < lVar24) {
                lVar28 = *(long *)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar28 + lVar24 * 8) = *(double *)(lVar28 + lVar24 * 8) + dVar30;
                pdVar3[uVar21] = pdVar3[uVar21] + dVar30;
              }
              uVar21 = uVar21 + 1;
              piVar11 = piVar11 + sVar14;
              pvVar16 = pvVar16 + 1;
            } while (uVar12 != uVar21);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 <= workspace->end);
      }
    }
  }
  auVar44 = _DAT_0036e1f0;
  auVar33 = _DAT_0036e1e0;
  if (input_data->Xc_indptr != (int *)0x0) {
    local_90 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      uVar12 = (long)pdVar4 + (-8 - (long)pdVar3);
      auVar34._8_4_ = (int)uVar12;
      auVar34._0_8_ = uVar12;
      auVar34._12_4_ = (int)(uVar12 >> 0x20);
      auVar35._0_8_ = uVar12 >> 3;
      auVar35._8_8_ = auVar34._8_8_ >> 3;
      uVar25 = 0;
      auVar35 = auVar35 ^ _DAT_0036e1f0;
      do {
        auVar42._8_4_ = (int)uVar25;
        auVar42._0_8_ = uVar25;
        auVar42._12_4_ = (int)(uVar25 >> 0x20);
        auVar43 = (auVar42 | auVar33) ^ auVar44;
        bVar8 = auVar35._0_4_ < auVar43._0_4_;
        iVar36 = auVar35._4_4_;
        iVar48 = auVar43._4_4_;
        if ((bool)(~(iVar36 < iVar48 || iVar48 == iVar36 && bVar8) & 1)) {
          pdVar3[uVar25] = dVar32;
        }
        if (iVar36 >= iVar48 && (iVar48 != iVar36 || !bVar8)) {
          pdVar3[uVar25 + 1] = dVar32;
        }
        uVar25 = uVar25 + 2;
      } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar25);
    }
    sVar14 = input_data->ncols_numeric;
    if (sVar14 != 0) {
      local_a8 = (double *)(local_90 + 1);
      local_38 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      sVar18 = workspace->end;
      uVar12 = 0;
      do {
        piVar11 = input_data->Xc_ind;
        lVar24 = (long)input_data->Xc_indptr[uVar12];
        key = local_90 + workspace->st;
        puVar13 = (ulong *)(local_a8 + sVar18);
        uVar25 = (long)puVar13 - (long)key >> 3;
        if (0 < (long)uVar25) {
          do {
            uVar21 = uVar25 >> 1;
            uVar23 = ~uVar21 + uVar25;
            uVar25 = uVar21;
            if ((key + uVar21 + 1)[-1] < (ulong)(long)piVar11[lVar24]) {
              key = key + uVar21 + 1;
              uVar25 = uVar23;
            }
          } while (0 < (long)uVar25);
        }
        if (key != puVar13) {
          lVar17 = (long)input_data->Xc_indptr[uVar12 + 1];
          lVar28 = lVar17 + -1;
          if (lVar17 != lVar24) {
            local_98 = (double)(long)piVar11[lVar17 + -1];
            uVar25 = *key;
            if (uVar25 <= (ulong)local_98) {
              do {
                iVar36 = piVar11[lVar24];
                if (iVar36 == (int)uVar25) {
                  local_78 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                              *)input_data->Xc[lVar24];
                  pdVar3 = (workspace->weights_arr).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish == pdVar3) {
                    dVar30 = 1.0;
                    if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                      local_a0._M_head_impl = key;
                      pVar52 = tsl::detail_robin_hash::
                               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               ::
                               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                         (local_38,key,
                                          (piecewise_construct_t *)&std::piecewise_construct,
                                          (tuple<const_unsigned_long_&> *)&local_a0,&local_b1);
                      puVar10 = (pVar52.first.m_bucket.m_bucket)->m_value + 8;
                      dVar32 = (double)local_68._0_8_;
                      goto LAB_00170ada;
                    }
                  }
                  else {
                    puVar10 = (uchar *)(pdVar3 + uVar25);
LAB_00170ada:
                    dVar30 = *(double *)puVar10;
                  }
                  if ((ulong)ABS((double)local_78) < 0x7ff0000000000000) {
                    pdVar3 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pdVar3[uVar12] = dVar30 * (double)local_78 + pdVar3[uVar12];
                  }
                  else {
                    pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                             .super__Vector_impl_data._M_start;
                    pdVar3[uVar12] = pdVar3[uVar12] - dVar30;
                  }
                  sVar18 = workspace->end;
                  if ((key == local_90 + sVar18) || (lVar24 == lVar28)) break;
                  piVar11 = input_data->Xc_ind;
                  piVar26 = piVar11 + lVar24;
                  key = key + 1;
                  uVar25 = (long)piVar11 + (lVar28 * 4 - (long)piVar26) + 4 >> 2;
                  if (0 < (long)uVar25) {
                    do {
                      uVar21 = uVar25 >> 1;
                      uVar23 = ~uVar21 + uVar25;
                      uVar25 = uVar21;
                      if ((ulong)(long)(piVar26 + uVar21 + 1)[-1] < *key) {
                        piVar26 = piVar26 + uVar21 + 1;
                        uVar25 = uVar23;
                      }
                    } while (0 < (long)uVar25);
                  }
LAB_00170b99:
                  lVar24 = (long)piVar26 - (long)piVar11 >> 2;
                }
                else {
                  if (iVar36 <= (int)uVar25) {
                    piVar26 = piVar11 + lVar24 + 1;
                    uVar21 = (long)piVar11 + (lVar28 * 4 - (long)(piVar11 + lVar24 + 1)) + 4 >> 2;
                    while (0 < (long)uVar21) {
                      uVar23 = uVar21 >> 1;
                      uVar22 = ~uVar23 + uVar21;
                      uVar21 = uVar23;
                      if ((ulong)(long)(piVar26 + uVar23 + 1)[-1] < uVar25) {
                        piVar26 = piVar26 + uVar23 + 1;
                        uVar21 = uVar22;
                      }
                    }
                    goto LAB_00170b99;
                  }
                  key = key + 1;
                  uVar25 = (long)puVar13 - (long)key >> 3;
                  while (0 < (long)uVar25) {
                    uVar21 = uVar25 >> 1;
                    uVar23 = ~uVar21 + uVar25;
                    uVar25 = uVar21;
                    if ((key + uVar21 + 1)[-1] < (ulong)(long)iVar36) {
                      key = key + uVar21 + 1;
                      uVar25 = uVar23;
                    }
                  }
                }
                puVar13 = (ulong *)(local_a8 + sVar18);
                if (((key == puVar13) || (lVar24 == lVar17)) ||
                   (uVar25 = *key, (ulong)local_98 < uVar25)) break;
              } while( true );
            }
            sVar14 = input_data->ncols_numeric;
          }
        }
        pdVar3 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[uVar12] =
             pdVar3[uVar12] /
             (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar12 < sVar14);
    }
  }
  auVar39._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar39._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar39._12_4_ = 0x45300000;
  dVar30 = (auVar39._8_8_ - 1.9342813113834067e+25) + (auVar39._0_8_ - 4503599627370496.0);
  pdVar3 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar3) &&
     (sVar14 = input_data->ncols_numeric, sVar14 != 0)) {
    pdVar4 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar18 = local_b0->parent;
    pIVar5 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar20 = 0;
    do {
      pdVar31 = pdVar4 + sVar20;
      if (*pdVar31 <= dVar30 && dVar30 != *pdVar31) {
        dVar49 = *(double *)
                  (*(long *)&pIVar5[sVar18].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar20 * 8);
        dVar46 = 2.0;
        sVar27 = sVar18;
        if (0x7fefffffffffffff < (ulong)ABS(dVar49)) {
          lVar24 = 2;
          do {
            if (sVar27 == 0) {
              pdVar3[sVar20] = NAN;
              dVar46 = 0.0;
              goto LAB_00170d35;
            }
            sVar27 = pIVar5[sVar27].parent;
            dVar49 = *(double *)
                      (*(long *)&pIVar5[sVar27].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar20 * 8);
            lVar24 = lVar24 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar49));
          auVar50._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar50._0_8_ = lVar24;
          auVar50._12_4_ = 0x45300000;
          dVar46 = (auVar50._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
        }
        pdVar3[sVar20] =
             dVar49 / *(double *)
                       (*(long *)&pIVar5[sVar27].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar20 * 8);
        dVar46 = dVar32 / dVar46;
LAB_00170d35:
        pdVar4[sVar20] = dVar46;
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar14);
  }
  pvVar16 = (local_b0->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((local_b0->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar16) &&
     (sVar14 = input_data->ncols_categ, sVar14 != 0)) {
    pdVar4 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar18 = local_b0->parent;
    pIVar5 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar11 = input_data->ncat;
    sVar20 = 0;
    do {
      if (dVar30 <= pdVar4[sVar20]) {
        pdVar38 = pvVar16[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pdVar31 = pvVar16[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar31 != pdVar38; pdVar31 = pdVar31 + 1)
        {
          *pdVar31 = *pdVar31 / pdVar4[sVar20];
        }
      }
      else {
        lVar24 = *(long *)&pIVar5[sVar18].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar49 = 2.0;
        sVar27 = sVar18;
        if (*(double *)(lVar24 + sVar20 * 8) <= 0.0) {
          lVar28 = 2;
          do {
            if (sVar27 == 0) goto LAB_00170e83;
            sVar27 = pIVar5[sVar27].parent;
            lVar24 = *(long *)&pIVar5[sVar27].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar28 = lVar28 + 2;
          } while (*(double *)(lVar24 + sVar20 * 8) <= 0.0);
          auVar47._8_4_ = (int)((ulong)lVar28 >> 0x20);
          auVar47._0_8_ = lVar28;
          auVar47._12_4_ = 0x45300000;
          dVar49 = (auVar47._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0);
        }
        iVar36 = piVar11[sVar20];
        if (0 < (long)iVar36) {
          lVar28 = *(long *)(*(long *)&pIVar5[sVar27].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar20 * 0x18);
          pdVar6 = pvVar16[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = 0;
          do {
            dVar46 = *(double *)(lVar28 + lVar17 * 8);
            dVar51 = 0.0;
            if (0.0 < dVar46) {
              dVar51 = dVar46 / *(double *)(lVar24 + sVar20 * 8);
            }
            pdVar6[lVar17] = dVar51 + pdVar6[lVar17];
            pdVar4[sVar20] = dVar32 / dVar49;
            lVar17 = lVar17 + 1;
          } while (iVar36 != lVar17);
        }
LAB_00170e83:
        dVar49 = 0.0;
        for (pdVar31 = pvVar16[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar31 !=
            pvVar16[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar31 = pdVar31 + 1) {
          dVar49 = dVar49 + *pdVar31;
        }
        pdVar4[sVar20] = dVar49;
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar14);
  }
  WVar2 = local_40->weigh_imp_rows;
  if (WVar2 == Flat) {
    pdVar38 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 / dVar32;
    }
    pdVar38 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 / dVar32;
    }
  }
  else if (WVar2 == Inverse) {
    pdVar38 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 / (SQRT(dVar32) * dVar32);
    }
    pdVar38 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 / (SQRT(dVar32) * dVar32);
    }
  }
  lVar24 = local_48 + 1;
  auVar40._8_4_ = (int)((ulong)lVar24 >> 0x20);
  auVar40._0_8_ = lVar24;
  auVar40._12_4_ = 0x45300000;
  dVar32 = (auVar40._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
  if (local_40->depth_imp == Higher) {
    pdVar38 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 * dVar32;
    }
    pdVar38 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 * dVar32;
    }
  }
  else if (local_40->depth_imp == Lower) {
    pdVar38 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 / dVar32;
    }
    pdVar38 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar31 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar31 != pdVar38;
        pdVar31 = pdVar31 + 1) {
      *pdVar31 = *pdVar31 / dVar32;
    }
  }
  if ((WVar2 != Prop) || (local_40->depth_imp != Same)) {
    sVar14 = input_data->ncols_numeric;
    if (sVar14 != 0) {
      pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar18 = 0;
      do {
        pdVar3[sVar18] = pdVar4[sVar18] * pdVar3[sVar18];
        sVar18 = sVar18 + 1;
      } while (sVar14 != sVar18);
    }
    sVar14 = input_data->ncols_categ;
    if (sVar14 != 0) {
      piVar11 = input_data->ncat;
      pdVar3 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar18 = 0;
      do {
        iVar36 = piVar11[sVar18];
        if (0 < (long)iVar36) {
          pdVar4 = pvVar16[sVar18].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar24 = 0;
          do {
            pdVar4[lVar24] = pdVar3[sVar18] * pdVar4[lVar24];
            lVar24 = lVar24 + 1;
          } while (iVar36 != lVar24);
        }
        sVar18 = sVar18 + 1;
      } while (sVar18 != sVar14);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}